

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O2

Promise<void> __thiscall
capnp::_::TestInterfaceImpl::baz(TestInterfaceImpl *this,BazContext context)

{
  Reader reader;
  CallContextHook *in_RDX;
  BazContext context_local;
  Reader local_728;
  Reader params;
  Reader local_6c8;
  NullableValue<kj::Exception> local_698;
  DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> _kjCondition;
  NullableValue<kj::Exception> local_1b8;
  
  *(int *)context.hook[1]._vptr_CallContextHook = *(int *)context.hook[1]._vptr_CallContextHook + 1;
  context_local.hook = in_RDX;
  CallContext<capnproto_test::capnp::test::TestInterface::BazParams,_capnproto_test::capnp::test::TestInterface::BazResults>
  ::getParams(&params,&context_local);
  capnproto_test::capnp::test::TestInterface::BazParams::Reader::getS(&local_728,&params);
  reader._reader.capTable = local_728._reader.capTable;
  reader._reader.segment = local_728._reader.segment;
  reader._reader.data = local_728._reader.data;
  reader._reader.pointers = local_728._reader.pointers;
  reader._reader.dataSize = local_728._reader.dataSize;
  reader._reader.pointerCount = local_728._reader.pointerCount;
  reader._reader._38_2_ = local_728._reader._38_2_;
  reader._reader.nestingLimit = local_728._reader.nestingLimit;
  reader._reader._44_4_ = local_728._reader._44_4_;
  checkTestMessage(reader);
  (*(context_local.hook)->_vptr_CallContextHook[1])();
  CallContext<capnproto_test::capnp::test::TestInterface::BazParams,_capnproto_test::capnp::test::TestInterface::BazResults>
  ::getParams(&local_6c8,&context_local);
  local_698.isSet = false;
  kj::Maybe<kj::Exception>::Maybe
            ((Maybe<kj::Exception> *)&local_1b8,(Maybe<kj::Exception> *)&local_698);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>>::operator!=
            (&_kjCondition,(DebugExpression<kj::Maybe<kj::Exception>> *)&local_1b8,(None *)&kj::none
            );
  kj::_::NullableValue<kj::Exception>::~NullableValue(&local_1b8);
  kj::_::NullableValue<kj::Exception>::~NullableValue(&local_698);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[89],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x392,ERROR,
               "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { context.getParams(); }) != kj::none\", _kjCondition"
               ,(char (*) [89])
                "failed: expected ::kj::runCatchingExceptions([&]() { context.getParams(); }) != kj::none"
               ,&_kjCondition);
  }
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&_kjCondition)
  ;
  kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> TestInterfaceImpl::baz(BazContext context) {
  ++callCount;
  auto params = context.getParams();
  checkTestMessage(params.getS());
  context.releaseParams();
  EXPECT_ANY_THROW(context.getParams());

  return kj::READY_NOW;
}